

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O0

err_t bign96Sign2(octet *sig,bign_params *params,octet *oid_der,size_t oid_len,octet *hash,
                 octet *privkey,void *t,size_t t_len)

{
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  size_t sVar4;
  ec_o *d_00;
  u64 *dest;
  long in_RCX;
  long *in_RSI;
  void *in_RDI;
  void *in_R8;
  void *in_R9;
  void *in_stack_00000008;
  size_t in_stack_00000010;
  octet *stack;
  octet *hash_state;
  word *s1;
  word *s0;
  word *R;
  word *k;
  word *d;
  ec_o *ec;
  void *state;
  u32 round;
  size_t n;
  err_t code;
  octet *in_stack_ffffffffffffff48;
  u64 *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  word *mod;
  octet *in_stack_ffffffffffffff60;
  word *b;
  char *in_stack_ffffffffffffff68;
  u64 *a;
  word *c;
  word *b_00;
  bign_params *in_stack_ffffffffffffff80;
  word *n_00;
  void *in_stack_ffffffffffffff88;
  word *a_00;
  bign96_deep_i in_stack_ffffffffffffff90;
  word *a_01;
  word *a_02;
  ec_o *ec_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar5;
  word *b_01;
  err_t local_4;
  
  uVar5 = 1;
  bVar1 = memIsValid(in_RSI,0x150);
  if (bVar1 == 0) {
    return 0x6d;
  }
  if (*in_RSI != 0x60) {
    return 0x1f6;
  }
  if ((in_RCX == -1) ||
     (sVar4 = oidFromDER(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                         in_stack_ffffffffffffff58), sVar4 == 0xffffffffffffffff)) {
    return 0x12d;
  }
  if ((in_stack_00000008 != (void *)0x0) &&
     (bVar1 = memIsValid(in_stack_00000008,in_stack_00000010), bVar1 == 0)) {
    return 0x6d;
  }
  bign96Start_keep(in_stack_ffffffffffffff90);
  d_00 = (ec_o *)blobCreate((size_t)in_stack_ffffffffffffff48);
  if (d_00 == (ec_o *)0x0) {
    return 0x6e;
  }
  eVar2 = bign96Start(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (eVar2 != 0) {
    blobClose((blob_t)0x16605b);
    return eVar2;
  }
  b_01 = (word *)d_00->f->n;
  ec_00 = d_00;
  bVar1 = memIsValid(in_R8,0x18);
  if ((((bVar1 != 0) && (bVar1 = memIsValid(in_R9,0x18), bVar1 != 0)) &&
      (bVar1 = memIsValid(in_RDI,0x22), bVar1 != 0)) &&
     (bVar1 = memIsDisjoint2(in_R8,0x18,in_RDI,0x22), bVar1 != 0)) {
    b_00 = (word *)((long)&(d_00->hdr).keep + (d_00->hdr).keep);
    a_01 = b_00 + (long)b_01;
    a_00 = a_01 + (long)b_01;
    n_00 = a_00 + (long)b_01 + 2;
    b = a_00 + (long)b_01 + 4;
    mod = b;
    a_02 = b_00;
    sVar4 = beltHash_keep();
    dest = (u64 *)((long)b + sVar4);
    u64From(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,0x1661ad);
    bVar1 = wwIsZero(a_02,(size_t)b_01);
    if ((bVar1 == 0) && (iVar3 = wwCmp(a_02,d_00->order,(size_t)b_01), iVar3 < 0)) {
      beltHashStart(in_stack_ffffffffffffff50);
      beltHashStepH(b,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      a = dest;
      c = mod;
      beltHash_keep();
      memCopy(dest,in_stack_ffffffffffffff48,0x166249);
      beltHashStepH(b,(size_t)mod,dest);
      if (in_stack_00000008 != (void *)0x0) {
        beltHashStepH(b,(size_t)mod,dest);
      }
      beltHashStepG((octet *)dest,in_stack_ffffffffffffff48);
      beltKeyExpand2((u32 *)dest,in_stack_ffffffffffffff48,0x1662a8);
      memCopy(dest,in_stack_ffffffffffffff48,0x1662bf);
      while( true ) {
        belt32BlockEncr((octet *)b,(u32 *)mod,(u32 *)dest);
        u64From(dest,in_stack_ffffffffffffff48,0x1662e7);
        bVar1 = wwIsZero(a_01,(size_t)b_01);
        if ((bVar1 == 0) && (iVar3 = wwCmp(a_01,d_00->order,(size_t)b_01), iVar3 < 0)) break;
        u64To(dest,(size_t)in_stack_ffffffffffffff48,(u64 *)0x16632e);
      }
      bVar1 = ecMulA(b_01,(word *)CONCAT44(uVar5,in_stack_ffffffffffffffb0),ec_00,(word *)d_00,
                     (size_t)a_02,a_01);
      if (bVar1 == 0) {
        blobClose((blob_t)0x166366);
        local_4 = 0x1f6;
      }
      else {
        (*d_00->f->to)((octet *)a_00,a_00,d_00->f,a);
        beltHashStepH(b,(size_t)mod,dest);
        beltHashStepH(b,(size_t)mod,dest);
        beltHashStepG2((octet *)b,(size_t)mod,dest);
        *(undefined1 *)((long)in_RDI + 0xb) = 0;
        *(undefined1 *)((long)in_RDI + 10) = 0;
        *(undefined1 *)((long)in_RDI + 0xc) = 0x80;
        u64From(dest,in_stack_ffffffffffffff48,0x16641a);
        zzMul(a_01,a_00,(size_t)n_00,b_00,(size_t)c,a);
        zzMod((word *)CONCAT44(uVar5,in_stack_ffffffffffffffb0),(word *)ec_00,(size_t)d_00,a_02,
              (size_t)a_01,a_00);
        zzSubMod(c,a,b,mod,(size_t)dest);
        u64From(dest,in_stack_ffffffffffffff48,0x1664a1);
        zzSubMod(c,a,b,mod,(size_t)dest);
        u64To(dest,(size_t)in_stack_ffffffffffffff48,(u64 *)0x1664de);
        blobClose((blob_t)0x1664e8);
        local_4 = 0;
      }
      return local_4;
    }
    blobClose((blob_t)0x1661e8);
    return 0x1f8;
  }
  blobClose((blob_t)0x1660fa);
  return 0x6d;
}

Assistant:

err_t bign96Sign2(octet sig[34], const bign_params* params,
	const octet oid_der[], size_t oid_len, const octet hash[24],
	const octet privkey[24], const void* t, size_t t_len)
{
	err_t code;
	size_t n;
	u32 round = 1;
	// состояние (буферы могут пересекаться)
	void* state;
	ec_o* ec;				/* описание эллиптической кривой */
	word* d;				/* [n] личный ключ */
	word* k;				/* [n] одноразовый личный ключ */
	word* R;				/* [2n] точка R */
	word* s0;				/* [W_OF_O(13)] первая часть подписи */
	word* s1;				/* [n] вторая часть подписи */
	octet* hash_state;		/* [beltHash_keep] состояние хэширования */
	octet* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (params->l != 96)
		return ERR_BAD_PARAMS;
	// проверить oid_der
	if (oid_len == SIZE_MAX || oidFromDER(0, oid_der, oid_len)  == SIZE_MAX)
		return ERR_BAD_OID;
	// проверить t
	if (!memIsNullOrValid(t, t_len))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(bign96Start_keep(bign96Sign2_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bign96Start(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	n = ec->f->n;
	// проверить входные указатели
	if (!memIsValid(hash, 24) ||
		!memIsValid(privkey, 24) ||
		!memIsValid(sig, 34) ||
		!memIsDisjoint2(hash, 24, sig, 34))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = s1 = objEnd(ec, word);
	k = d + n;
	R = k + n;
	s0 = R + n + W_OF_O(13);
	hash_state = (octet*)(s0 + W_OF_O(13));
	stack = hash_state + beltHash_keep();
	// загрузить d
	wwFrom(d, privkey, 24);
	if (wwIsZero(d, n) || wwCmp(d, ec->order, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_PRIVKEY;
	}
	// хэшировать oid
	beltHashStart(hash_state);
	beltHashStepH(oid_der, oid_len, hash_state);
	// сгенерировать k по алгоритму 6.3.3
	{
		// theta <- belt-hash(oid || d || t)
		memCopy(stack, hash_state, beltHash_keep());
		beltHashStepH(privkey, 24, stack);
		if (t != 0)
			beltHashStepH(t, t_len, stack);
		beltHashStepG(stack, stack);
		beltKeyExpand2((u32*)stack, stack, 32);
		// k <- H
		memCopy(k, hash, 24);
		// k <- belt32Block(k, theta) пока k \notin {1,..., q - 1}
		while (1)
		{
			belt32BlockEncr((octet*)k, (u32*)stack, &round);
			wwFrom(k, k, 24);
			if (!wwIsZero(k, n) && wwCmp(k, ec->order, n) < 0)
				break;
			wwTo(k, 24, k);
		}
	}
	// R <- k G
	if (!ecMulA(R, ec->base, ec, k, n, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	qrTo((octet*)R, ecX(R), ec->f, stack);
	// s0 <- belt-hash(oid || R || H) mod 2^80 + 2^l
	beltHashStepH(R, 24, hash_state);
	beltHashStepH(hash, 24, hash_state);
	beltHashStepG2(sig, 10, hash_state);
	sig[10] = sig[11] = 0, sig[12] = 0x80;
	wwFrom(s0, sig, 13);
	// R <- (s0 + 2^96) d
	zzMul(R, s0, W_OF_O(13), d, n, stack);
	// s1 <- R mod q
	zzMod(s1, R, n + W_OF_O(13), ec->order, n, stack);
	// s1 <- (k - s1 - H) mod q
	zzSubMod(s1, k, s1, ec->order, n);
	wwFrom(k, hash, 24);
	zzSubMod(s1, s1, k, ec->order, n);
	// выгрузить s1
	wwTo(sig + 10, 24, s1);
	// все нормально
	blobClose(state);
	return ERR_OK;
}